

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O1

void __thiscall CInput::HandleJoystickButtonEvent(CInput *this,SDL_Event *Event)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  long lVar5;
  
  iVar2 = (*(this->super_IEngineInput).super_IInput.super_IInterface._vptr_IInterface[7])();
  if (CONCAT44(extraout_var,iVar2) == 0) {
    return;
  }
  if (*(Uint32 *)(CONCAT44(extraout_var,iVar2) + 0x78) != (Event->display).display) {
    return;
  }
  uVar4 = (ulong)(Event->display).event;
  if (0xb < uVar4) {
    return;
  }
  iVar2 = (Event->display).event + 0x1a6;
  if (Event->type == 0x604) {
    this->m_aInputState[uVar4 + 0x1a6] = false;
    iVar3 = (this->super_IEngineInput).super_IInput.m_NumEvents;
    lVar5 = (long)iVar3;
    if (lVar5 == 0x20) {
      return;
    }
    (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar5].m_Key = iVar2;
    (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar5].m_Flags = 2;
    (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar5].m_aText[0] = '\0';
    (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar5].m_InputCount =
         this->m_InputCounter;
  }
  else {
    if (Event->type != 0x603) {
      return;
    }
    this->m_aInputState[uVar4 + 0x1a6] = true;
    iVar1 = this->m_InputCounter;
    this->m_aInputCount[uVar4 + 0x1a6] = (unsigned_short)iVar1;
    iVar3 = (this->super_IEngineInput).super_IInput.m_NumEvents;
    lVar5 = (long)iVar3;
    if (lVar5 == 0x20) {
      return;
    }
    (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar5].m_Key = iVar2;
    (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar5].m_Flags = 1;
    (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar5].m_aText[0] = '\0';
    (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar5].m_InputCount = iVar1;
  }
  (this->super_IEngineInput).super_IInput.m_NumEvents = iVar3 + 1;
  return;
}

Assistant:

void CInput::HandleJoystickButtonEvent(const SDL_Event &Event)
{
	CJoystick *pJoystick = GetActiveJoystick();
	if(!pJoystick || pJoystick->GetInstanceID() != Event.jbutton.which)
		return;
	if(Event.jbutton.button >= NUM_JOYSTICK_BUTTONS)
		return;

	const int Key = Event.jbutton.button + KEY_JOYSTICK_BUTTON_0;

	if(Event.type == SDL_JOYBUTTONDOWN)
	{
		m_aInputState[Key] = true;
		m_aInputCount[Key] = m_InputCounter;
		AddEvent(0, Key, IInput::FLAG_PRESS);
	}
	else if(Event.type == SDL_JOYBUTTONUP)
	{
		m_aInputState[Key] = false;
		AddEvent(0, Key, IInput::FLAG_RELEASE);
	}
}